

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

void __thiscall Catch::JunitReporter::testRunStarting(JunitReporter *this,TestRunInfo *runInfo)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"testsuites",&local_31);
  XmlWriter::startElement(&this->xml,&local_30,Newline|Indent);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void JunitReporter::testRunStarting( TestRunInfo const& runInfo )  {
        CumulativeReporterBase::testRunStarting( runInfo );
        xml.startElement( "testsuites" );
    }